

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O0

int __thiscall ncnn::Reshape::forward(Reshape *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  int _c;
  int _h_1;
  int _w_2;
  int _h;
  int _w_1;
  float *bptr;
  int p;
  int j;
  int i;
  float *ptr;
  int _w;
  int total;
  size_t elemsize;
  Mat *in_stack_fffffffffffffe50;
  Mat *in_stack_fffffffffffffe58;
  Mat *pMVar3;
  size_t in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  Mat *in_stack_fffffffffffffe70;
  Allocator *in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  Mat *in_stack_fffffffffffffe98;
  Allocator *in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  Mat *in_stack_ffffffffffffff08;
  Mat local_98;
  float *local_58;
  int local_4c;
  int local_48;
  int local_44;
  float *local_40;
  int local_38;
  int local_34;
  undefined8 local_30;
  Mat *local_20;
  long local_18;
  int local_4;
  
  local_30 = *(undefined8 *)(in_RSI + 0x10);
  local_34 = *(int *)(in_RSI + 0x2c) * *(int *)(in_RSI + 0x30) * *(int *)(in_RSI + 0x34);
  if (*(int *)(in_RDI + 0x90) == 1) {
    local_38 = *(int *)(in_RDI + 0x80);
    if (local_38 == 0) {
      local_38 = *(int *)(in_RSI + 0x2c);
    }
    if (local_38 == -1) {
      local_38 = local_34;
    }
    if (*(int *)(in_RDI + 0x8c) == 1) {
      local_20 = in_RDX;
      local_18 = in_RSI;
      Mat::create(in_stack_fffffffffffffe70,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                  in_stack_fffffffffffffe60,(Allocator *)in_stack_fffffffffffffe58);
      bVar1 = Mat::empty(in_stack_fffffffffffffe50);
      if (bVar1) {
        return -100;
      }
      local_40 = Mat::operator_cast_to_float_(local_20);
      for (local_44 = 0; local_44 < *(int *)(local_18 + 0x30); local_44 = local_44 + 1) {
        for (local_48 = 0; local_48 < *(int *)(local_18 + 0x2c); local_48 = local_48 + 1) {
          for (local_4c = 0; local_4c < *(int *)(local_18 + 0x34); local_4c = local_4c + 1) {
            pMVar3 = &local_98;
            Mat::channel(in_stack_fffffffffffffe58,(int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(pMVar3);
            Mat::~Mat((Mat *)0x16ee2f);
            *local_40 = pfVar2[local_44 * *(int *)(local_18 + 0x2c) + local_48];
            local_58 = pfVar2;
            local_40 = local_40 + 1;
          }
        }
      }
    }
    else {
      Mat::reshape(in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,in_stack_fffffffffffffe88);
      Mat::operator=(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
      Mat::~Mat((Mat *)0x16ef3d);
    }
  }
  else if (*(int *)(in_RDI + 0x90) == 2) {
    pMVar3 = (Mat *)&stack0xfffffffffffffed0;
    Mat::reshape(in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe88);
    Mat::operator=(pMVar3,in_stack_fffffffffffffe50);
    Mat::~Mat((Mat *)0x16f068);
  }
  else if (*(int *)(in_RDI + 0x90) == 3) {
    in_stack_fffffffffffffe50 = (Mat *)&stack0xfffffffffffffe80;
    Mat::reshape(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00,
                 in_stack_fffffffffffffefc,in_stack_fffffffffffffef0);
    Mat::operator=(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    Mat::~Mat((Mat *)0x16f1dc);
  }
  bVar1 = Mat::empty(in_stack_fffffffffffffe50);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Reshape::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    size_t elemsize = bottom_blob.elemsize;
    int total = bottom_blob.w * bottom_blob.h * bottom_blob.c;

    if (ndim == 1)
    {
        int _w = w;

        if (_w == 0)
            _w = bottom_blob.w;

        if (_w == -1)
            _w = total;

        if (permute == 1)
        {
            top_blob.create(_w, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            // c-h-w to h-w-c
            float* ptr = top_blob;
            for (int i=0; i<bottom_blob.h; i++)
            {
                for (int j=0; j<bottom_blob.w; j++)
                {
                    for (int p=0; p<bottom_blob.c; p++)
                    {
                        const float* bptr = bottom_blob.channel(p);
                        *ptr++ = bptr[i*bottom_blob.w + j];
                    }
                }
            }
        }
        else
        {
            top_blob = bottom_blob.reshape(_w, opt.blob_allocator);
        }
    }
    else if (ndim == 2)
    {
        int _w = w;
        int _h = h;

        if (_w == 0)
            _w = bottom_blob.w;
        if (_h == 0)
            _h = bottom_blob.h;

        if (_w == -1)
            _w = total / _h;
        if (_h == -1)
            _h = total / _w;

        top_blob = bottom_blob.reshape(_w, _h, opt.blob_allocator);
    }
    else if (ndim == 3)
    {
        int _w = w;
        int _h = h;
        int _c = c;

        if (_w == 0)
            _w = bottom_blob.w;
        if (_h == 0)
            _h = bottom_blob.h;
        if (_c == 0)
            _c = bottom_blob.c;

        if (_w == -1)
            _w = total / _c / _h;
        if (_h == -1)
            _h = total / _c / _w;
        if (_c == -1)
            _c = total / _h / _w;

        top_blob = bottom_blob.reshape(_w, _h, _c, opt.blob_allocator);
    }

    if (top_blob.empty())
        return -100;

    return 0;
}